

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall fasttext::Args::parseArgs(Args *this,int argc,char **argv)

{
  char *pcVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  Args *pAVar5;
  _Alloc_hider _Var6;
  long lVar7;
  double dVar8;
  string command;
  allocator local_e1;
  Args *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8 [2];
  char local_c8 [16];
  Args *local_b8;
  Args *local_b0;
  string *local_a8;
  Args *local_a0;
  Args *local_98;
  Args *local_90;
  Args *local_88;
  Args *local_80;
  Args *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::string((string *)local_50,argv[1],(allocator *)local_d8);
  iVar3 = std::__cxx11::string::compare((char *)local_50);
  if (iVar3 == 0) {
    this->loss = softmax;
    this->model = sup;
    this->minCount = 1;
    this->lr = 0.1;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    if (iVar3 == 0) {
      this->model = cbow;
    }
  }
  local_e0 = this;
  if (argc < 3) {
LAB_0010e117:
    if (((local_e0->input)._M_string_length != 0) && ((local_e0->output)._M_string_length != 0)) {
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Empty input or output path.",0x1b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    printHelp(local_e0);
LAB_0010e1b8:
    exit(1);
  }
  local_b0 = (Args *)&this->pretrainedVectors;
  local_b8 = (Args *)&this->label;
  local_a8 = (string *)&this->propsStr;
  local_a0 = (Args *)&this->ipaoutput;
  local_98 = (Args *)&this->morphoutput;
  local_90 = (Args *)&this->lemmaoutput;
  local_88 = (Args *)&this->suboutput;
  local_80 = (Args *)&this->output;
  local_78 = (Args *)&this->test;
  lVar7 = 2;
LAB_0010db29:
  pcVar1 = argv[lVar7];
  if (*pcVar1 != '-') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Provided argument without a dash! Usage:",0x28);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    printHelp(local_e0);
    goto LAB_0010e1b8;
  }
  if ((pcVar1[1] == 'h') && (pcVar1[2] == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Here is the help! Usage:",0x18);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    printHelp(local_e0);
    goto LAB_0010e1b8;
  }
  iVar3 = strcmp(pcVar1,"-input");
  if (iVar3 == 0) {
    std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
    pAVar5 = local_e0;
  }
  else {
    iVar3 = strcmp(pcVar1,"-test");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
      pAVar5 = local_78;
      goto LAB_0010de53;
    }
    iVar3 = strcmp(pcVar1,"-output");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
      pAVar5 = local_80;
      goto LAB_0010de53;
    }
    iVar3 = strcmp(pcVar1,"-suboutput");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
      pAVar5 = local_88;
      goto LAB_0010de53;
    }
    iVar3 = strcmp(pcVar1,"-lemmaoutput");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
      pAVar5 = local_90;
      goto LAB_0010de53;
    }
    iVar3 = strcmp(pcVar1,"-morphoutput");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
      pAVar5 = local_98;
      goto LAB_0010de53;
    }
    iVar3 = strcmp(pcVar1,"-ipaoutput");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
      pAVar5 = local_a0;
      goto LAB_0010de53;
    }
    iVar3 = strcmp(pcVar1,"-props");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
      std::__cxx11::string::operator=(local_a8,(string *)local_d8);
      if (local_d8[0] !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8) {
        operator_delete(local_d8[0]);
      }
      pAVar5 = local_e0;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar2 = (local_e0->propsStr)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (local_e0->propsStr)._M_string_length);
      initProps(pAVar5,&local_70);
      _Var6._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0010de72;
      goto LAB_0010de6d;
    }
    iVar3 = strcmp(pcVar1,"-lr");
    if (iVar3 == 0) {
      dVar8 = atof(argv[lVar7 + 1]);
      local_e0->lr = dVar8;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-lrUpdateRate");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->lrUpdateRate = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-dim");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->dim = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-ws");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->ws = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-epoch");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->epoch = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-minCount");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->minCount = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-neg");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->neg = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-minn");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->minn = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-maxn");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->maxn = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-wordNgrams");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->wordNgrams = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-loss");
    if (iVar3 == 0) {
      pcVar1 = argv[lVar7 + 1];
      if (*pcVar1 == 'n') {
        if ((pcVar1[1] != 's') || (pcVar1[2] != '\0')) goto LAB_0010e089;
        local_e0->loss = ns;
      }
      else if (((*pcVar1 == 'h') && (pcVar1[1] == 's')) && (pcVar1[2] == '\0')) {
        local_e0->loss = hs;
      }
      else {
LAB_0010e089:
        iVar3 = strcmp(pcVar1,"softmax");
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Unknown loss: ",0xe);
          poVar4 = std::operator<<((ostream *)&std::cout,argv[lVar7 + 1]);
          std::endl<char,std::char_traits<char>>(poVar4);
          printHelp(local_e0);
          goto LAB_0010e1b8;
        }
        local_e0->loss = softmax;
      }
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-bucket");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->bucket = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-thread");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->thread = iVar3;
      goto LAB_0010de72;
    }
    if ((pcVar1[1] == 't') && (pcVar1[2] == '\0')) {
      dVar8 = atof(argv[lVar7 + 1]);
      local_e0->t = dVar8;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-label");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
      pAVar5 = local_b8;
      goto LAB_0010de53;
    }
    iVar3 = strcmp(pcVar1,"-verbose");
    if (iVar3 == 0) {
      iVar3 = atoi(argv[lVar7 + 1]);
      local_e0->verbose = iVar3;
      goto LAB_0010de72;
    }
    iVar3 = strcmp(pcVar1,"-pretrainedVectors");
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unknown argument: ",0x12);
      poVar4 = std::operator<<((ostream *)&std::cout,argv[lVar7]);
      std::endl<char,std::char_traits<char>>(poVar4);
      printHelp(local_e0);
      goto LAB_0010e1b8;
    }
    std::__cxx11::string::string((string *)local_d8,argv[lVar7 + 1],&local_e1);
    pAVar5 = local_b0;
  }
LAB_0010de53:
  std::__cxx11::string::operator=((string *)pAVar5,(string *)local_d8);
  _Var6._M_p = (pointer)local_d8[0];
  if (local_d8[0] !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8) {
LAB_0010de6d:
    operator_delete(_Var6._M_p);
  }
LAB_0010de72:
  lVar7 = lVar7 + 2;
  if (argc <= (int)lVar7) goto LAB_0010e117;
  goto LAB_0010db29;
}

Assistant:

void Args::parseArgs(int argc, char** argv) {
  std::string command(argv[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  int ai = 2;
  while (ai < argc) {
    if (argv[ai][0] != '-') {
      std::cout << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    if (strcmp(argv[ai], "-h") == 0) {
      std::cout << "Here is the help! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    } else if (strcmp(argv[ai], "-input") == 0) {
      input = std::string(argv[ai + 1]); 
	} else if (strcmp(argv[ai], "-test") == 0) {
      test = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-output") == 0) {
      output = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-suboutput") == 0) {
      suboutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-lemmaoutput") == 0) {
      lemmaoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-morphoutput") == 0) {
      morphoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-ipaoutput") == 0) {
      ipaoutput = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-props") == 0) {
      propsStr = std::string(argv[ai + 1]);
      initProps(propsStr);
    } else if (strcmp(argv[ai], "-lr") == 0) {
      lr = atof(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-lrUpdateRate") == 0) {
      lrUpdateRate = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-dim") == 0) {
      dim = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-ws") == 0) {
      ws = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-epoch") == 0) {
      epoch = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-minCount") == 0) {
      minCount = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-neg") == 0) {
      neg = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-minn") == 0) {
          minn = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai],"-maxn") == 0) {
          maxn = atoi(argv[ai + 1]);
    }else if (strcmp(argv[ai], "-wordNgrams") == 0) {
      wordNgrams = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-loss") == 0) {
      if (strcmp(argv[ai + 1], "hs") == 0) {
        loss = loss_name::hs;
      } else if (strcmp(argv[ai + 1], "ns") == 0) {
        loss = loss_name::ns;
      } else if (strcmp(argv[ai + 1], "softmax") == 0) {
        loss = loss_name::softmax;
      } else {
        std::cout << "Unknown loss: " << argv[ai + 1] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } else if (strcmp(argv[ai], "-bucket") == 0) {
      bucket = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-thread") == 0) {
      thread = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-t") == 0) {
      t = atof(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-label") == 0) {
      label = std::string(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-verbose") == 0) {
      verbose = atoi(argv[ai + 1]);
    } else if (strcmp(argv[ai], "-pretrainedVectors") == 0) {
      pretrainedVectors = std::string(argv[ai + 1]);
    } else {
      std::cout << "Unknown argument: " << argv[ai] << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    ai += 2;
  }
  if (input.empty() || output.empty()) {
    std::cout << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
}